

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int combine_delete_insn(gen_ctx_t gen_ctx,MIR_insn_t def_insn,bb_insn_t_conflict bb_insn)

{
  uint var_00;
  MIR_reg_t var;
  bb_insn_t_conflict bb_insn_local;
  MIR_insn_t def_insn_local;
  gen_ctx_t gen_ctx_local;
  
  if ((*(ushort *)&def_insn->ops[0].field_0x8 & 0xff) == 2) {
    var_00 = def_insn->ops[0].u.reg;
    if ((gen_ctx->combine_ctx->var_ref_ages_addr[var_00] ==
         gen_ctx->combine_ctx->curr_bb_var_ref_age) &&
       (gen_ctx->combine_ctx->var_refs_addr[var_00].del_p == '\0')) {
      if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        fprintf((FILE *)gen_ctx->debug_file,"      deleting now dead insn ");
        print_bb_insn(gen_ctx,(bb_insn_t_conflict)def_insn->data,1);
      }
      remove_bb_insn_dead_var(gen_ctx,bb_insn,var_00);
      move_bb_insn_dead_vars
                (gen_ctx,bb_insn,(bb_insn_t_conflict)def_insn->data,hard_reg_used_in_bb_insn_p);
      gen_delete_insn(gen_ctx,def_insn);
      gen_ctx->combine_ctx->var_refs_addr[var_00].del_p = '\x01';
      gen_ctx_local._4_4_ = 1;
    }
    else {
      gen_ctx_local._4_4_ = 0;
    }
    return gen_ctx_local._4_4_;
  }
  __assert_fail("def_insn->ops[0].mode == MIR_OP_VAR",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x2214,"int combine_delete_insn(gen_ctx_t, MIR_insn_t, bb_insn_t)");
}

Assistant:

static int combine_delete_insn (gen_ctx_t gen_ctx, MIR_insn_t def_insn, bb_insn_t bb_insn) {
  MIR_reg_t var;

  gen_assert (def_insn->ops[0].mode == MIR_OP_VAR);
  var = def_insn->ops[0].u.var;
  if (var_ref_ages_addr[var] != curr_bb_var_ref_age || var_refs_addr[var].del_p) return FALSE;
  DEBUG (2, {
    fprintf (debug_file, "      deleting now dead insn ");
    print_bb_insn (gen_ctx, def_insn->data, TRUE);
  });
  remove_bb_insn_dead_var (gen_ctx, bb_insn, var);
  move_bb_insn_dead_vars (gen_ctx, bb_insn, def_insn->data, hard_reg_used_in_bb_insn_p);
  /* We should delete the def insn here because of possible substitution of the def
     insn 'r0 = ... r0 ...'.  We still need valid entry for def here to find obsolete
     definiton, e.g. "r1 = r0; r0 = ...; r0 = ... (deleted); ...= ...r1..." */
  gen_delete_insn (gen_ctx, def_insn);
  var_refs_addr[var].del_p = TRUE; /* to exclude repetitive deletion */
  return TRUE;
}